

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

ggml_tensor * ggml_reshape(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b)

{
  int *piVar1;
  undefined1 auVar2 [32];
  undefined4 extraout_EAX;
  ggml_tensor *pgVar3;
  ggml_tensor *pgVar4;
  ggml_tensor *extraout_RAX;
  uint uVar5;
  ggml_tensor *in_RCX;
  size_t sVar6;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint extraout_EDX_01;
  int32_t value;
  int extraout_EDX_02;
  ggml_tensor *extraout_RDX;
  ggml_tensor *extraout_RDX_00;
  ggml_tensor *extraout_RDX_01;
  ggml_tensor *extraout_RDX_02;
  ggml_tensor *extraout_RDX_03;
  ggml_tensor *tensor;
  uint uVar7;
  ggml_tensor *pgVar8;
  uint uVar9;
  ggml_tensor *pgVar10;
  ulong unaff_R12;
  int *unaff_R14;
  ggml_tensor *pgVar11;
  int iStack_1b8;
  int iStack_1b4;
  undefined8 uStack_1b0;
  ggml_tensor *pgStack_1a0;
  ggml_tensor *pgStack_198;
  ggml_type gStack_190;
  int iStack_18c;
  undefined8 uStack_188;
  ggml_tensor *pgStack_178;
  ggml_tensor *pgStack_170;
  undefined4 uStack_168;
  int iStack_164;
  ggml_tensor *pgStack_160;
  ulong uStack_158;
  ggml_type gStack_100;
  int iStack_fc;
  ggml_tensor *pgStack_f8;
  ggml_tensor *pgStack_f0;
  ggml_tensor *pgStack_e8;
  undefined1 auStack_e0 [16];
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  ggml_tensor *pgStack_c0;
  int iStack_98;
  int iStack_94;
  undefined8 uStack_90;
  ggml_tensor *pgStack_88;
  ggml_tensor *pgStack_80;
  int iStack_64;
  ggml_tensor *pgStack_60;
  int iStack_4c;
  int iStack_48;
  int iStack_44;
  ggml_tensor *pgStack_40;
  ggml_tensor *pgStack_38;
  int iStack_28;
  int iStack_24;
  ggml_tensor *pgStack_20;
  
  pgVar3 = (ggml_tensor *)(ulong)a->type;
  if (a->nb[0] == GGML_TYPE_SIZE[(long)pgVar3]) {
    unaff_R14 = GGML_BLCK_SIZE;
    in_RCX = b;
    if (a->nb[1] != (a->nb[0] * (long)a->ne[0]) / (ulong)(long)GGML_BLCK_SIZE[(long)pgVar3])
    goto LAB_00125b3d;
    if ((a->nb[2] != a->nb[1] * (long)a->ne[1]) || (a->nb[3] != a->nb[2] * (long)a->ne[2]))
    goto LAB_00125b3d;
    if (b->nb[0] != GGML_TYPE_SIZE[b->type]) goto LAB_00125b42;
    unaff_R14 = (int *)(long)GGML_BLCK_SIZE[b->type];
    if (b->nb[1] != (b->nb[0] * (long)b->ne[0]) / (ulong)unaff_R14) goto LAB_00125b42;
    unaff_R14 = (int *)b->nb[2];
    if ((ggml_tensor *)unaff_R14 != (ggml_tensor *)(b->nb[1] * (long)b->ne[1])) goto LAB_00125b42;
    unaff_R14 = (int *)((long)unaff_R14 * (long)b->ne[2]);
    if ((ggml_tensor *)b->nb[3] != (ggml_tensor *)unaff_R14) goto LAB_00125b42;
    if (a->ne[1] * a->ne[0] * a->ne[2] * a->ne[3] == b->ne[1] * b->ne[0] * b->ne[2] * b->ne[3]) {
      if ((a->grad == (ggml_tensor *)0x0) && (b->grad == (ggml_tensor *)0x0)) {
        pgStack_20 = (ggml_tensor *)0x125b22;
        pgVar3 = ggml_new_tensor_impl(ctx,a->type,b->n_dims,b->ne,a->data);
        pgVar3->op = GGML_OP_RESHAPE;
        pgVar3->grad = (ggml_tensor *)0x0;
        pgVar3->src0 = a;
        pgVar3->src1 = (ggml_tensor *)0x0;
        return pgVar3;
      }
      goto LAB_00125b47;
    }
  }
  else {
LAB_00125b3d:
    b = in_RCX;
    pgStack_20 = (ggml_tensor *)0x125b42;
    ggml_reshape_cold_1();
LAB_00125b42:
    pgStack_20 = (ggml_tensor *)0x125b47;
    ggml_reshape_cold_2();
LAB_00125b47:
    pgStack_20 = (ggml_tensor *)0x125b4c;
    ggml_reshape_cold_4();
  }
  pgStack_20 = (ggml_tensor *)ggml_reshape_2d;
  ggml_reshape_cold_3();
  pgVar8 = (ggml_tensor *)(ulong)extraout_EDX;
  pgVar4 = (ggml_tensor *)(ulong)pgVar3->type;
  pgStack_20 = a;
  if (pgVar3->nb[0] == GGML_TYPE_SIZE[(long)pgVar4]) {
    if (pgVar3->nb[1] !=
        (pgVar3->nb[0] * (long)pgVar3->ne[0]) / (ulong)(long)GGML_BLCK_SIZE[(long)pgVar4])
    goto LAB_00125c09;
    if ((pgVar3->nb[2] != pgVar3->nb[1] * (long)pgVar3->ne[1]) ||
       (pgVar3->nb[3] != pgVar3->nb[2] * (long)pgVar3->ne[2])) goto LAB_00125c09;
    iStack_24 = (int)b;
    if (pgVar3->ne[1] * pgVar3->ne[0] * pgVar3->ne[2] * pgVar3->ne[3] != iStack_24 * extraout_EDX)
    goto LAB_00125c0e;
    if (pgVar3->grad == (ggml_tensor *)0x0) {
      pgStack_38 = (ggml_tensor *)0x125bee;
      pgVar4 = ggml_new_tensor_impl(ctx,pgVar3->type,2,&iStack_28,pgVar3->data);
      pgVar4->op = GGML_OP_RESHAPE;
      pgVar4->grad = (ggml_tensor *)0x0;
      pgVar4->src0 = pgVar3;
      pgVar4->src1 = (ggml_tensor *)0x0;
      return pgVar4;
    }
  }
  else {
LAB_00125c09:
    pgStack_38 = (ggml_tensor *)0x125c0e;
    ggml_reshape_2d_cold_1();
LAB_00125c0e:
    pgStack_38 = (ggml_tensor *)0x125c13;
    ggml_reshape_2d_cold_2();
  }
  pgStack_38 = (ggml_tensor *)ggml_reshape_3d;
  ggml_reshape_2d_cold_3();
  pgVar10 = (ggml_tensor *)(ulong)extraout_EDX_00;
  tensor = (ggml_tensor *)(ulong)pgVar4->type;
  pgVar11 = (ggml_tensor *)unaff_R14;
  pgStack_40 = pgVar3;
  pgStack_38 = (ggml_tensor *)unaff_R14;
  if (pgVar4->nb[0] == GGML_TYPE_SIZE[(long)tensor]) {
    pgVar11 = (ggml_tensor *)(long)GGML_BLCK_SIZE[(long)tensor];
    if (pgVar4->nb[1] != (pgVar4->nb[0] * (long)pgVar4->ne[0]) / (ulong)pgVar11) goto LAB_00125cdc;
    pgVar11 = (ggml_tensor *)pgVar4->nb[2];
    if (pgVar11 != (ggml_tensor *)(pgVar4->nb[1] * (long)pgVar4->ne[1])) goto LAB_00125cdc;
    pgVar11 = (ggml_tensor *)((long)pgVar11 * (long)pgVar4->ne[2]);
    if ((ggml_tensor *)pgVar4->nb[3] != pgVar11) goto LAB_00125cdc;
    iStack_48 = (int)b;
    iStack_44 = (int)pgVar8;
    if (pgVar4->ne[1] * pgVar4->ne[0] * pgVar4->ne[2] * pgVar4->ne[3] !=
        iStack_48 * extraout_EDX_00 * iStack_44) goto LAB_00125ce1;
    if (pgVar4->grad == (ggml_tensor *)0x0) {
      pgStack_60 = (ggml_tensor *)0x125cbf;
      pgVar3 = ggml_new_tensor_impl(ctx,pgVar4->type,3,&iStack_4c,pgVar4->data);
      pgVar3->op = GGML_OP_RESHAPE;
      pgVar3->grad = (ggml_tensor *)0x0;
      pgVar3->src0 = pgVar4;
      pgVar3->src1 = (ggml_tensor *)0x0;
      return pgVar3;
    }
  }
  else {
LAB_00125cdc:
    pgStack_60 = (ggml_tensor *)0x125ce1;
    ggml_reshape_3d_cold_1();
LAB_00125ce1:
    pgStack_60 = (ggml_tensor *)0x125ce6;
    ggml_reshape_3d_cold_2();
  }
  pgStack_60 = (ggml_tensor *)ggml_view_1d;
  ggml_reshape_3d_cold_3();
  pgStack_60 = pgVar4;
  if (tensor->grad == (ggml_tensor *)0x0) {
    pgVar3 = ggml_new_tensor_impl
                       (ctx,tensor->type,1,&iStack_64,
                        (void *)((long)tensor->data + (long)(b->ne + -2)));
    pgVar3->op = GGML_OP_VIEW;
    pgVar3->grad = (ggml_tensor *)0x0;
    pgVar3->src0 = tensor;
    pgVar3->src1 = (ggml_tensor *)0x0;
    return pgVar3;
  }
  ggml_view_1d_cold_1();
  pgStack_88 = pgVar4;
  pgStack_80 = pgVar11;
  if (tensor->grad == (ggml_tensor *)0x0) {
    uStack_90 = 0x100000001;
    iStack_94 = (int)b;
    pgVar3 = ggml_new_tensor_impl
                       (ctx,tensor->type,2,&iStack_98,
                        (void *)((long)tensor->data + (long)(pgVar10->ne + -2)));
    pgVar3->nb[1] = (size_t)pgVar8;
    sVar6 = (long)(int)b * (long)pgVar8;
    pgVar3->nb[2] = sVar6;
    pgVar3->nb[3] = sVar6;
    pgVar3->op = GGML_OP_VIEW;
    pgVar3->grad = (ggml_tensor *)0x0;
    pgVar3->src0 = tensor;
    pgVar3->src1 = (ggml_tensor *)0x0;
    return pgVar3;
  }
  ggml_view_2d_cold_1();
  pgStack_c0 = pgVar4;
  if (extraout_EDX_01 < 4) {
    uVar5 = (uint)b;
    if (3 < uVar5) goto LAB_00125ecb;
    uVar7 = (uint)pgVar8;
    pgVar11 = (ggml_tensor *)((ulong)pgVar8 & 0xffffffff);
    if (3 < uVar7) goto LAB_00125ed0;
    uVar9 = (uint)pgVar10;
    if (3 < uVar9) goto LAB_00125ed5;
    unaff_R12 = (ulong)extraout_EDX_01;
    if (extraout_EDX_01 == uVar5) goto LAB_00125eda;
    if (extraout_EDX_01 == uVar7) goto LAB_00125edf;
    if (extraout_EDX_01 == uVar9) goto LAB_00125ee4;
    if (uVar5 == uVar7) goto LAB_00125ee9;
    if (uVar5 == uVar9) goto LAB_00125eee;
    if (uVar7 == uVar9) goto LAB_00125ef3;
    pgVar4 = tensor;
    if (tensor->grad == (ggml_tensor *)0x0) {
      pgStack_e8 = (ggml_tensor *)0x125e49;
      pgVar3 = ggml_new_tensor_impl(ctx,tensor->type,tensor->n_dims,tensor->ne,tensor->data);
      *(int *)((long)&uStack_d0 + unaff_R12 * 4) = tensor->ne[0];
      *(int *)((long)&uStack_d0 + ((ulong)b & 0xffffffff) * 4) = tensor->ne[1];
      *(int *)((long)&uStack_d0 + ((ulong)pgVar8 & 0xffffffff) * 4) = tensor->ne[2];
      *(int *)((long)&uStack_d0 + ((ulong)pgVar10 & 0xffffffff) * 4) = tensor->ne[3];
      *(int *)(auStack_e0 + unaff_R12 * 4) = (int)tensor->nb[0];
      *(int *)(auStack_e0 + ((ulong)b & 0xffffffff) * 4) = (int)tensor->nb[1];
      *(int *)(auStack_e0 + ((ulong)pgVar8 & 0xffffffff) * 4) = (int)tensor->nb[2];
      *(int *)(auStack_e0 + ((ulong)pgVar10 & 0xffffffff) * 4) = (int)tensor->nb[3];
      *(undefined8 *)pgVar3->ne = uStack_d0;
      *(undefined8 *)(pgVar3->ne + 2) = uStack_c8;
      auVar2 = vpmovsxdq_avx2(auStack_e0);
      *(undefined1 (*) [32])pgVar3->nb = auVar2;
      pgVar3->op = GGML_OP_PERMUTE;
      pgVar3->grad = (ggml_tensor *)0x0;
      pgVar3->src0 = tensor;
      pgVar3->src1 = (ggml_tensor *)0x0;
      return pgVar3;
    }
  }
  else {
    pgStack_e8 = (ggml_tensor *)0x125ecb;
    ggml_permute_cold_1();
LAB_00125ecb:
    pgStack_e8 = (ggml_tensor *)0x125ed0;
    ggml_permute_cold_2();
LAB_00125ed0:
    pgStack_e8 = (ggml_tensor *)0x125ed5;
    ggml_permute_cold_3();
LAB_00125ed5:
    pgStack_e8 = (ggml_tensor *)0x125eda;
    ggml_permute_cold_4();
LAB_00125eda:
    pgStack_e8 = (ggml_tensor *)0x125edf;
    ggml_permute_cold_11();
LAB_00125edf:
    pgStack_e8 = (ggml_tensor *)0x125ee4;
    ggml_permute_cold_10();
LAB_00125ee4:
    pgStack_e8 = (ggml_tensor *)0x125ee9;
    ggml_permute_cold_9();
LAB_00125ee9:
    pgStack_e8 = (ggml_tensor *)0x125eee;
    ggml_permute_cold_8();
LAB_00125eee:
    pgStack_e8 = (ggml_tensor *)0x125ef3;
    ggml_permute_cold_7();
LAB_00125ef3:
    pgStack_e8 = (ggml_tensor *)0x125ef8;
    ggml_permute_cold_6();
  }
  pgStack_e8 = (ggml_tensor *)ggml_transpose;
  ggml_permute_cold_5();
  pgStack_e8 = pgVar4;
  if (tensor->grad == (ggml_tensor *)0x0) {
    pgStack_f0 = (ggml_tensor *)0x125f1d;
    pgVar3 = ggml_new_tensor_impl(ctx,tensor->type,tensor->n_dims,tensor->ne,tensor->data);
    pgVar3->ne[0] = tensor->ne[1];
    pgVar3->ne[1] = tensor->ne[0];
    pgVar3->nb[0] = tensor->nb[1];
    pgVar3->nb[1] = tensor->nb[0];
    pgVar3->op = GGML_OP_TRANSPOSE;
    pgVar3->grad = (ggml_tensor *)0x0;
    pgVar3->src0 = tensor;
    pgVar3->src1 = (ggml_tensor *)0x0;
    return pgVar3;
  }
  pgStack_f0 = (ggml_tensor *)ggml_get_rows;
  ggml_transpose_cold_1();
  pgStack_f8 = pgVar4;
  pgStack_f0 = pgVar11;
  if ((((tensor->ne[2] == 1) && (pgVar11 = tensor, tensor->ne[3] == 1)) &&
      (pgVar4 = extraout_RDX, extraout_RDX->ne[1] == 1)) &&
     (((extraout_RDX->ne[2] == 1 && (extraout_RDX->ne[3] == 1)) &&
      (extraout_RDX->type == GGML_TYPE_I32)))) {
    if ((tensor->grad == (ggml_tensor *)0x0) && (extraout_RDX->grad == (ggml_tensor *)0x0)) {
      _gStack_100 = CONCAT44(extraout_RDX->ne[0],tensor->ne[0]);
      pgVar3 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,2,(int *)&gStack_100,(void *)0x0);
      pgVar3->op = GGML_OP_GET_ROWS;
      pgVar3->grad = (ggml_tensor *)0x0;
      pgVar3->src0 = tensor;
      pgVar3->src1 = extraout_RDX;
      return pgVar3;
    }
  }
  else {
    ggml_get_rows_cold_1();
  }
  ggml_get_rows_cold_2();
  if (tensor->grad == (ggml_tensor *)0x0) {
    pgVar3 = ggml_new_tensor_impl(ctx,tensor->type,tensor->n_dims,tensor->ne,tensor->data);
    pgVar4 = ggml_new_i32(ctx,value);
    pgVar3->op = GGML_OP_DIAG_MASK_INF;
    pgVar3->grad = (ggml_tensor *)0x0;
    pgVar3->src0 = tensor;
    pgVar3->src1 = pgVar4;
    return pgVar3;
  }
  ggml_diag_mask_inf_cold_1();
  if (tensor->grad == (ggml_tensor *)0x0) {
    pgVar3 = ggml_new_tensor_impl(ctx,tensor->type,tensor->n_dims,tensor->ne,tensor->data);
    pgVar3->op = GGML_OP_SOFT_MAX;
    pgVar3->grad = (ggml_tensor *)0x0;
    pgVar3->src0 = tensor;
    pgVar3->src1 = (ggml_tensor *)0x0;
    return pgVar3;
  }
  ggml_soft_max_cold_1();
  pgStack_160 = pgVar4;
  uStack_158 = unaff_R12;
  if (extraout_EDX_02 < 0) {
    pgStack_170 = (ggml_tensor *)0x12611e;
    ggml_rope_cold_1();
    pgStack_178 = pgVar4;
  }
  else {
    pgStack_178 = tensor;
    if (tensor->grad == (ggml_tensor *)0x0) {
      pgStack_170 = (ggml_tensor *)0x1260bb;
      uStack_168 = extraout_EAX;
      pgVar3 = ggml_new_tensor_impl(ctx,tensor->type,tensor->n_dims,tensor->ne,tensor->data);
      _uStack_168 = CONCAT44(3,uStack_168);
      pgStack_170 = (ggml_tensor *)0x1260de;
      pgVar4 = ggml_new_tensor_impl(ctx,GGML_TYPE_I32,1,&iStack_164,(void *)0x0);
      piVar1 = (int *)pgVar4->data;
      *piVar1 = extraout_EDX_02;
      piVar1[1] = (int)b;
      piVar1[2] = (int)pgVar8;
      pgVar3->op = GGML_OP_ROPE;
      pgVar3->grad = (ggml_tensor *)0x0;
      pgVar3->src0 = tensor;
      pgVar3->src1 = pgVar4;
      return pgVar3;
    }
  }
  pgStack_170 = (ggml_tensor *)ggml_conv_1d_1s;
  ggml_rope_cold_2();
  pgVar3 = pgStack_178;
  pgStack_170 = pgVar11;
  if ((extraout_RDX_00->ne[2] == 1) && (pgVar3 = extraout_RDX_00, extraout_RDX_00->ne[3] == 1)) {
    pgVar11 = tensor;
    if (tensor->ne[1] != extraout_RDX_00->ne[1]) goto LAB_001261b1;
    if (tensor->ne[3] == 1) {
      if ((tensor->grad == (ggml_tensor *)0x0) && (extraout_RDX_00->grad == (ggml_tensor *)0x0)) {
        gStack_190 = extraout_RDX_00->ne[0];
        iStack_18c = tensor->ne[2];
        uStack_188 = 0x100000001;
        pgStack_198 = (ggml_tensor *)0x126188;
        pgVar3 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,2,(int *)&gStack_190,(void *)0x0);
        pgVar3->op = GGML_OP_CONV_1D_1S;
        pgVar3->grad = (ggml_tensor *)0x0;
        pgVar3->src0 = tensor;
        pgVar3->src1 = extraout_RDX_00;
        return pgVar3;
      }
      goto LAB_001261ac;
    }
  }
  else {
    pgStack_198 = (ggml_tensor *)0x1261ac;
    ggml_conv_1d_1s_cold_1();
LAB_001261ac:
    pgStack_198 = (ggml_tensor *)0x1261b1;
    ggml_conv_1d_1s_cold_4();
LAB_001261b1:
    pgStack_198 = (ggml_tensor *)0x1261b6;
    ggml_conv_1d_1s_cold_2();
  }
  pgStack_198 = (ggml_tensor *)ggml_conv_1d_2s;
  ggml_conv_1d_1s_cold_3();
  pgStack_1a0 = pgVar3;
  pgStack_198 = pgVar11;
  if ((extraout_RDX_01->ne[2] == 1) && (extraout_RDX_01->ne[3] == 1)) {
    if (tensor->ne[1] == extraout_RDX_01->ne[1]) {
      if (tensor->ne[3] != 1) goto LAB_0012625b;
      if ((tensor->grad == (ggml_tensor *)0x0) && (extraout_RDX_01->grad == (ggml_tensor *)0x0)) {
        iStack_1b8 = extraout_RDX_01->ne[0] / 2;
        iStack_1b4 = tensor->ne[2];
        uStack_1b0 = 0x100000001;
        pgVar3 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,2,&iStack_1b8,(void *)0x0);
        pgVar3->op = GGML_OP_CONV_1D_2S;
        pgVar3->grad = (ggml_tensor *)0x0;
        pgVar3->src0 = tensor;
        pgVar3->src1 = extraout_RDX_01;
        return pgVar3;
      }
      goto LAB_00126251;
    }
  }
  else {
    ggml_conv_1d_2s_cold_1();
LAB_00126251:
    ggml_conv_1d_2s_cold_4();
  }
  ggml_conv_1d_2s_cold_2();
LAB_0012625b:
  ggml_conv_1d_2s_cold_3();
  if (((extraout_RDX_02->ne[0] == tensor->ne[0]) && (extraout_RDX_02->ne[2] == tensor->ne[2])) &&
     (extraout_RDX_02->ne[3] == tensor->ne[3])) {
    if (((tensor->grad == (ggml_tensor *)0x0) && (extraout_RDX_02->grad == (ggml_tensor *)0x0)) &&
       (b->grad == (ggml_tensor *)0x0)) {
      pgVar3 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,4,tensor->ne,(void *)0x0);
      pgVar3->op = GGML_OP_FLASH_ATTN;
      pgVar3->grad = (ggml_tensor *)0x0;
      pgVar3->src0 = tensor;
      pgVar3->src1 = extraout_RDX_02;
      pgVar3->opt[0] = b;
      pgVar4 = ggml_new_i32(ctx,(uint)pgVar8 & 0xff);
      pgVar3->opt[1] = pgVar4;
      return pgVar3;
    }
  }
  else {
    ggml_flash_attn_cold_1();
  }
  ggml_flash_attn_cold_2();
  if (((extraout_RDX_03->ne[0] == tensor->ne[0]) && (extraout_RDX_03->ne[2] == tensor->ne[2])) &&
     (extraout_RDX_03->ne[3] == tensor->ne[3])) {
    if ((((tensor->grad == (ggml_tensor *)0x0) && (extraout_RDX_03->grad == (ggml_tensor *)0x0)) &&
        (b->grad == (ggml_tensor *)0x0)) &&
       ((pgVar8->grad == (ggml_tensor *)0x0 && (pgVar10->grad == (ggml_tensor *)0x0)))) {
      pgVar3 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,4,tensor->ne,(void *)0x0);
      pgVar3->op = GGML_OP_FLASH_FF;
      pgVar3->grad = (ggml_tensor *)0x0;
      pgVar3->src0 = tensor;
      pgVar3->src1 = extraout_RDX_03;
      pgVar3->opt[0] = b;
      pgVar3->opt[1] = pgVar8;
      pgVar3->opt[2] = pgVar10;
      return pgVar3;
    }
    ggml_flash_ff_cold_2();
  }
  ggml_flash_ff_cold_1();
  tensor->is_param = true;
  if (tensor->grad == (ggml_tensor *)0x0) {
    pgVar3 = ggml_new_tensor_impl(ctx,tensor->type,tensor->n_dims,tensor->ne,(void *)0x0);
    tensor->grad = pgVar3;
    return pgVar3;
  }
  ggml_set_param_cold_1();
  ggml_build_forward_impl((ggml_cgraph *)ctx,tensor,true);
  return extraout_RAX;
}

Assistant:

struct ggml_tensor * ggml_reshape(
        struct ggml_context * ctx,
        struct ggml_tensor * a,
        struct ggml_tensor * b) {
    GGML_ASSERT(ggml_is_contiguous(a));
    GGML_ASSERT(ggml_is_contiguous(b));
    GGML_ASSERT(ggml_nelements(a) == ggml_nelements(b));

    bool is_node = false;

    if (a->grad || b->grad) {
        GGML_ASSERT(false); // TODO: implement backward
        is_node = true;
    }

    struct ggml_tensor * result = ggml_new_tensor_impl(ctx, a->type, b->n_dims, b->ne, a->data);

    result->op   = GGML_OP_RESHAPE;
    result->grad = is_node ? ggml_dup_tensor(ctx, result) : NULL;
    result->src0 = a;
    result->src1 = NULL;

    return result;
}